

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtNegVar(word *t,int nVars,int iVar)

{
  ulong *puVar1;
  word *pwVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x8c0,"int Abc_TtNegVar(word *, int, int)");
  }
  bVar7 = (byte)iVar;
  if (nVars < 7) {
    uVar6 = (uint)((~(*t << ((byte)(1 << (bVar7 & 0x1f)) & 0x3f)) & s_Truths6[iVar] & *t) == 0);
  }
  else if (iVar < 6) {
    bVar3 = (char)nVars - 6U & 0x1f;
    uVar8 = 0;
    uVar10 = (ulong)(uint)(1 << bVar3);
    if (1 << bVar3 < 1) {
      uVar10 = uVar8;
    }
    do {
      if (uVar10 == uVar8) {
        return 1;
      }
      puVar1 = t + uVar8;
      uVar8 = uVar8 + 1;
    } while ((~(*puVar1 << ((byte)(1 << (bVar7 & 0x1f)) & 0x3f)) & s_Truths6[iVar] & *puVar1) == 0);
LAB_00681bca:
    uVar6 = 0;
  }
  else {
    uVar6 = 1;
    bVar3 = bVar7 - 6 & 0x1f;
    uVar9 = 1 << bVar3;
    pwVar2 = t + (1 << ((char)nVars - 6U & 0x1f));
    uVar4 = 0 << bVar3;
    if (0 < (int)uVar9) {
      uVar4 = uVar9;
    }
    for (; t < pwVar2; t = t + (2 << (bVar7 - 6 & 0x1f))) {
      uVar10 = 0;
      while (uVar4 != uVar10) {
        puVar1 = t + uVar10;
        lVar5 = (long)(int)uVar9 + uVar10;
        uVar10 = uVar10 + 1;
        if ((t[lVar5] & ~*puVar1) != 0) goto LAB_00681bca;
      }
    }
  }
  return uVar6;
}

Assistant:

static inline int Abc_TtNegVar( word * t, int nVars, int iVar )
{
    assert( iVar < nVars );
    if ( nVars <= 6 )
        return Abc_Tt6NegVar( t[0], iVar );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        int nWords = Abc_TtWordNum( nVars );
        for ( i = 0; i < nWords; i++ )
            if ( ((t[i] << Shift) & t[i] & s_Truths6[iVar]) != (t[i] & s_Truths6[iVar]) )
                return 0;
        return 1;
    }
    else
    {
        int i, Step = (1 << (iVar - 6));
        word * tLimit = t + Abc_TtWordNum( nVars );
        for ( ; t < tLimit; t += 2*Step )
            for ( i = 0; i < Step; i++ )
                if ( (t[i] & t[Step+i]) != t[Step+i] )
                    return 0;
        return 1;
    }
}